

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  void *pvVar1;
  char *__s;
  ulong __n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  cJSON *pcVar5;
  char *pcVar6;
  void *__s_00;
  void *__s_01;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  uint needed;
  cJSON **ppcVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  size_t __n_00;
  ulong uVar15;
  ulong uVar16;
  int local_68;
  
  __n = (ulong)(uint)depth;
  ppcVar10 = &item->child;
  __n_00 = 0xfffffffffffffff8;
  uVar14 = 0;
  pcVar5 = (cJSON *)ppcVar10;
  do {
    pcVar5 = pcVar5->next;
    uVar14 = uVar14 - 1;
    __n_00 = __n_00 + 8;
  } while (pcVar5 != (cJSON *)0x0);
  if ((int)uVar14 == -1) {
    if (p == (printbuffer *)0x0) {
      iVar12 = 3;
      if (fmt != 0) {
        iVar12 = depth + 4;
      }
      pcVar6 = (char *)(*cJSON_malloc)((long)iVar12);
    }
    else {
      iVar12 = 3;
      if (fmt != 0) {
        iVar12 = depth + 4;
      }
      pcVar6 = ensure(p,iVar12);
    }
    if (pcVar6 != (char *)0x0) {
      *pcVar6 = '{';
      if (fmt == 0) {
        pcVar7 = pcVar6 + 1;
      }
      else {
        pcVar7 = pcVar6 + 2;
        pcVar6[1] = '\n';
        if (0 < depth) {
          memset(pcVar7,9,__n);
          pcVar7 = pcVar6 + (ulong)(depth - 1) + 3;
        }
      }
      pcVar7[0] = '}';
      pcVar7[1] = '\0';
      return pcVar6;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n_00);
    if (__s_00 != (void *)0x0) {
      __s_01 = (*cJSON_malloc)(__n_00);
      if (__s_01 != (void *)0x0) {
        bVar3 = false;
        memset(__s_00,0,__n_00);
        memset(__s_01,0,__n_00);
        local_68 = 7;
        if (fmt != 0) {
          local_68 = depth + 8;
        }
        pcVar5 = *ppcVar10;
        if (pcVar5 == (cJSON *)0x0) {
          bVar3 = true;
          bVar2 = true;
        }
        else {
          iVar12 = 2;
          if (fmt != 0) {
            iVar12 = depth + 5;
          }
          lVar11 = 0;
          do {
            pcVar6 = print_string_ptr(pcVar5->string,(printbuffer *)0x0);
            *(char **)((long)__s_01 + lVar11) = pcVar6;
            pcVar7 = print_value(pcVar5,depth + 1U,fmt,(printbuffer *)0x0);
            *(char **)((long)__s_00 + lVar11) = pcVar7;
            if (pcVar7 == (char *)0x0 || pcVar6 == (char *)0x0) {
              bVar3 = true;
            }
            else {
              sVar9 = strlen(pcVar7);
              sVar8 = strlen(pcVar6);
              local_68 = local_68 + iVar12 + (int)sVar8 + (int)sVar9;
            }
            pcVar5 = pcVar5->next;
            bVar2 = !bVar3;
          } while ((pcVar5 != (cJSON *)0x0) && (lVar11 = lVar11 + 8, !bVar3));
          bVar3 = !bVar3;
        }
        if (bVar2) {
          pcVar6 = (char *)(*cJSON_malloc)((long)local_68);
        }
        else {
          pcVar6 = (char *)0x0;
        }
        uVar15 = ~uVar14;
        if ((bool)(pcVar6 != (char *)0x0 & bVar3)) {
          *pcVar6 = '{';
          if (fmt == 0) {
            pcVar7 = pcVar6 + 1;
          }
          else {
            pcVar7 = pcVar6 + 2;
            pcVar6[1] = '\n';
          }
          *pcVar7 = '\0';
          uVar16 = 0;
          do {
            if (-1 < depth && fmt != 0) {
              memset(pcVar7,9,(ulong)(depth + 1U));
              pcVar7 = pcVar7 + __n + 1;
            }
            __s = *(char **)((long)__s_01 + uVar16 * 8);
            sVar9 = strlen(__s);
            memcpy(pcVar7,__s,sVar9);
            pcVar7[sVar9] = ':';
            if (fmt == 0) {
              lVar11 = sVar9 + 1;
            }
            else {
              pcVar7[sVar9 + 1] = '\t';
              lVar11 = sVar9 + 2;
            }
            strcpy(pcVar7 + lVar11,*(char **)((long)__s_00 + uVar16 * 8));
            sVar9 = strlen(*(char **)((long)__s_00 + uVar16 * 8));
            pcVar7 = pcVar7 + lVar11 + sVar9;
            if ((-uVar14 - 2 & 0xffffffff) != uVar16) {
              *pcVar7 = ',';
              pcVar7 = pcVar7 + 1;
            }
            if (fmt != 0) {
              *pcVar7 = '\n';
              pcVar7 = pcVar7 + 1;
            }
            *pcVar7 = '\0';
            (*cJSON_free)(*(void **)((long)__s_01 + uVar16 * 8));
            (*cJSON_free)(*(void **)((long)__s_00 + uVar16 * 8));
            uVar16 = uVar16 + 1;
          } while (uVar15 + (uVar15 == 0) != uVar16);
          (*cJSON_free)(__s_01);
          (*cJSON_free)(__s_00);
          if (0 < depth && fmt != 0) {
            memset(pcVar7,9,__n);
            pcVar7 = pcVar7 + (ulong)(depth - 1) + 1;
          }
          pcVar7[0] = '}';
          pcVar7[1] = '\0';
          return pcVar6;
        }
        lVar11 = 0;
        do {
          pvVar1 = *(void **)((long)__s_01 + lVar11 * 8);
          if (pvVar1 != (void *)0x0) {
            (*cJSON_free)(pvVar1);
          }
          pvVar1 = *(void **)((long)__s_00 + lVar11 * 8);
          if (pvVar1 != (void *)0x0) {
            (*cJSON_free)(pvVar1);
          }
          lVar11 = lVar11 + 1;
        } while (uVar15 + (uVar15 == 0) != lVar11);
        (*cJSON_free)(__s_01);
      }
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar12 = p->offset;
    pcVar6 = ensure(p,(fmt != 0) + 2);
    if (pcVar6 != (char *)0x0) {
      iVar13 = (fmt != 0) + 1;
      *pcVar6 = '{';
      if (fmt == 0) {
        pcVar6 = pcVar6 + 1;
      }
      else {
        pcVar6[1] = '\n';
        pcVar6 = pcVar6 + 2;
      }
      *pcVar6 = '\0';
      p->offset = p->offset + iVar13;
      pcVar5 = *ppcVar10;
      if (pcVar5 != (cJSON *)0x0) {
        needed = depth + 1;
        do {
          if (fmt != 0) {
            pcVar6 = ensure(p,needed);
            if (pcVar6 == (char *)0x0) {
              return (char *)0x0;
            }
            if (-1 < depth) {
              memset(pcVar6,9,(ulong)needed);
            }
            p->offset = p->offset + needed;
          }
          print_string_ptr(pcVar5->string,p);
          if (p->buffer == (char *)0x0) {
            iVar4 = 0;
          }
          else {
            iVar4 = p->offset;
            sVar9 = strlen(p->buffer + iVar4);
            iVar4 = (int)sVar9 + iVar4;
          }
          p->offset = iVar4;
          pcVar6 = ensure(p,iVar13);
          if (pcVar6 == (char *)0x0) {
            return (char *)0x0;
          }
          *pcVar6 = ':';
          if (fmt != 0) {
            pcVar6[1] = '\t';
          }
          p->offset = p->offset + iVar13;
          print_value(pcVar5,needed,fmt,p);
          if (p->buffer == (char *)0x0) {
            iVar4 = 0;
          }
          else {
            iVar4 = p->offset;
            sVar9 = strlen(p->buffer + iVar4);
            iVar4 = (int)sVar9 + iVar4;
          }
          p->offset = iVar4;
          iVar4 = ((fmt != 0) + 1) - (uint)(pcVar5->next == (cJSON *)0x0);
          pcVar6 = ensure(p,iVar4 + 1);
          if (pcVar6 == (char *)0x0) {
            return (char *)0x0;
          }
          if (pcVar5->next != (cJSON *)0x0) {
            *pcVar6 = ',';
            pcVar6 = pcVar6 + 1;
          }
          if (fmt != 0) {
            *pcVar6 = '\n';
            pcVar6 = pcVar6 + 1;
          }
          *pcVar6 = '\0';
          p->offset = p->offset + iVar4;
          pcVar5 = pcVar5->next;
        } while (pcVar5 != (cJSON *)0x0);
      }
      iVar13 = 2;
      if (fmt != 0) {
        iVar13 = depth + 2;
      }
      pcVar6 = ensure(p,iVar13);
      if (pcVar6 != (char *)0x0) {
        if (fmt != 0) {
          if (depth < 1) {
            iVar12 = 0;
          }
          else {
            memset(pcVar6,9,__n);
            pcVar6 = pcVar6 + __n;
            iVar12 = depth;
          }
        }
        pcVar6[0] = '}';
        pcVar6[1] = '\0';
        return p->buffer + iVar12;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child && !fail)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}